

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::IsNullOrUndefRegOpnd(Lowerer *this,RegOpnd *opnd)

{
  StackSym *this_00;
  bool bVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  this_00 = opnd->m_sym;
  bVar1 = StackSym::IsIntConst(this_00);
  if ((!bVar1) && (bVar1 = StackSym::IsFloatConst(this_00), !bVar1)) {
    local_1c = (opnd->super_Opnd).m_valueType.field_0;
    bVar1 = ValueType::IsUndefined((ValueType *)&local_1c.field_0);
    if (bVar1) {
      return true;
    }
    local_1a = (opnd->super_Opnd).m_valueType.field_0;
    bVar1 = ValueType::IsNull((ValueType *)&local_1a.field_0);
    return bVar1;
  }
  return false;
}

Assistant:

bool Lowerer::IsNullOrUndefRegOpnd(IR::RegOpnd *opnd) const
{
    StackSym *sym = opnd->m_sym;

    if (sym->IsIntConst() || sym->IsFloatConst())
    {
        return false;
    }

    return opnd->GetValueType().IsUndefined() || opnd->GetValueType().IsNull();
}